

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_grids_to_quads(Ref<embree::SceneGraph::GridMeshNode> *gmesh)

{
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar1;
  long lVar2;
  ulong uVar3;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar4;
  ulong uVar5;
  reference pvVar6;
  size_type sVar7;
  value_type *__x;
  long *in_RSI;
  BBox1f in_RDI;
  size_t t;
  size_t timeSteps;
  uint a2;
  uint a3;
  uint a1;
  uint a0;
  uint x;
  uint y;
  uint resY;
  uint resX;
  uint lineStride;
  uint startVtx;
  size_t i;
  Ref<embree::SceneGraph::QuadMeshNode> qmesh;
  value_type *in_stack_fffffffffffffde8;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_stack_fffffffffffffdf0;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this;
  size_t in_stack_fffffffffffffe78;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *this_00;
  BBox1f time_range;
  size_type local_148;
  Quad local_138;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  undefined1 local_f1;
  MaterialNode *local_f0;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0 [3];
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_b8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_b0;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_a8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_50;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_48;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_40;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_38;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_30;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_20;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_10;
  
  time_range = in_RDI;
  aVar4 = (anon_union_8_2_4062524c_for_Vec2<float>_1)::operator_new(0xd8);
  local_f1 = 1;
  local_50 = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)(*in_RSI + 0xa0);
  this_00 = &local_d8;
  aVar1 = *(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_50->components;
  local_48 = this_00;
  if (aVar1 != (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) {
    lVar2 = *(long *)local_d8;
    local_d8 = aVar1;
    (**(code **)(lVar2 + 0x10))();
    aVar1 = local_d8;
  }
  local_d8 = aVar1;
  local_f0 = ((Ref<embree::SceneGraph::MaterialNode> *)*in_RSI)[0xd].ptr;
  QuadMeshNode::QuadMeshNode
            ((QuadMeshNode *)&this_00->field_0,(Ref<embree::SceneGraph::MaterialNode> *)*in_RSI,
             time_range,in_stack_fffffffffffffe78);
  local_f1 = 0;
  local_38 = local_d0;
  local_40 = aVar4;
  if (aVar4 != (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) {
    lVar2 = *(long *)local_d0[0];
    local_d0[0] = aVar4;
    (**(code **)(lVar2 + 0x10))();
    aVar4 = local_d0[0];
  }
  local_d0[0] = aVar4;
  local_30 = &local_d8;
  if (local_d8 != (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) {
    (**(code **)(*(long *)local_d8 + 0x18))();
  }
  local_100 = 0;
  while( true ) {
    uVar3 = local_100;
    uVar5 = (**(code **)(*(long *)*in_RSI + 0x70))();
    if (uVar5 <= uVar3) break;
    pvVar6 = std::
             vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ::operator[]((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)(*in_RSI + 0x88),local_100);
    local_104 = pvVar6->startVtx;
    pvVar6 = std::
             vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ::operator[]((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)(*in_RSI + 0x88),local_100);
    local_108 = pvVar6->lineStride;
    pvVar6 = std::
             vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ::operator[]((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)(*in_RSI + 0x88),local_100);
    local_10c = (uint)pvVar6->resX;
    pvVar6 = std::
             vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ::operator[]((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)(*in_RSI + 0x88),local_100);
    local_110 = (uint)pvVar6->resY;
    for (local_114 = 0; local_114 < local_110 - 1; local_114 = local_114 + 1) {
      for (local_118 = 0; local_118 < local_10c - 1; local_118 = local_118 + 1) {
        local_11c = local_104 + local_114 * local_108 + local_118;
        local_120 = local_11c + 1;
        local_124 = local_11c + local_108;
        local_128 = local_11c + local_108 + 1;
        local_b0 = local_d0;
        QuadMeshNode::Quad::Quad(&local_138,local_11c,local_120,local_128,local_124);
        std::
        vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
        ::push_back(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      }
    }
    local_100 = local_100 + 1;
  }
  sVar7 = std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RSI + 0x70));
  for (local_148 = 0; local_148 < sVar7; local_148 = local_148 + 1) {
    local_b8 = local_d0;
    __x = (value_type *)((long)local_d0[0] + 0x70);
    this = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)*in_RSI;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)&this[4].
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(this,__x);
  }
  local_20 = local_d0;
  local_10 = local_d0[0];
  *(anon_union_8_2_4062524c_for_Vec2<float>_1 *)time_range = local_d0[0];
  if (*(long *)time_range != 0) {
    (**(code **)(**(long **)time_range + 0x10))();
  }
  local_a8 = local_d0;
  if (local_d0[0] != (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) {
    (**(code **)(*(long *)local_d0[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_grids_to_quads ( Ref<SceneGraph::GridMeshNode> gmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(gmesh->material,gmesh->time_range,0);

    for (size_t i=0; i<gmesh->numPrimitives(); i++)
    {
      const unsigned int startVtx = gmesh->grids[i].startVtx;
      const unsigned int lineStride = gmesh->grids[i].lineStride;
      const unsigned int resX = gmesh->grids[i].resX;
      const unsigned int resY = gmesh->grids[i].resY;

      for (unsigned int y=0; y<resY-1; y++)
      {
        for (unsigned int x=0; x<resX-1; x++)
        {
          const unsigned int a0 = startVtx + y * lineStride + x;
          const unsigned int a1 = a0 + 1;
          const unsigned int a3 = a0 + lineStride;
          const unsigned int a2 = a0 + lineStride + 1;
          qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a3));
        }
      }
    }
    const size_t timeSteps = gmesh->positions.size();
    for (size_t t=0;t<timeSteps;t++)
      qmesh->positions.push_back(gmesh->positions[t]);
    return qmesh.dynamicCast<SceneGraph::Node>();
  }